

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_reportModelDense(HModel *this)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  ostream *poVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  char buff [16];
  char local_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N=",2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->numCol);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",  M=",5);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->numRow);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",  NZ= ",7);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[this->numCol]);
  local_48[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_48,1);
  if ((this->numCol < 0xb) && (this->numRow < 0x65)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
    uVar8 = (uint)((ulong)((long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar8) {
      uVar11 = 0;
      do {
        sprintf(local_48,"%2.1g ",
                (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11]);
        sVar5 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar5);
        uVar11 = uVar11 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar11);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------A------\n",0xe);
    if (0 < this->numRow) {
      iVar9 = 0;
      do {
        if (0 < this->numCol) {
          lVar12 = 0;
          do {
            piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = piVar1[lVar12];
            uVar11 = (ulong)(int)uVar8;
            if (piVar2[uVar11] == iVar9) {
              uVar7 = piVar1[lVar12 + 1];
              uVar6 = (ulong)uVar8;
            }
            else {
              uVar7 = piVar1[lVar12 + 1];
              if ((int)uVar8 <= (int)uVar7) {
                uVar8 = uVar7;
              }
              uVar6 = uVar11;
              do {
                if ((long)(int)uVar8 == uVar6) goto LAB_00131165;
                uVar11 = uVar6 + 1;
                lVar3 = uVar6 + 1;
                uVar6 = uVar11;
              } while (piVar2[lVar3] != iVar9);
            }
            if ((int)uVar6 < (int)uVar7) {
              sprintf(local_48,"%2.1g ",
                      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11]);
              *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
              sVar5 = strlen(local_48);
              pcVar10 = local_48;
            }
            else {
LAB_00131165:
              *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
              sVar5 = 1;
              pcVar10 = " ";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar5);
            lVar12 = lVar12 + 1;
          } while (lVar12 < this->numCol);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        iVar9 = iVar9 + 1;
      } while (iVar9 < this->numRow);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------LB------\n",0xf)
    ;
    if (0 < this->numRow) {
      lVar12 = 0;
      do {
        if ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] <= -1e+200) {
          builtin_strncpy(local_48,"-inf",5);
        }
        else {
          sprintf(local_48,"%2.1g ");
        }
        *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
        sVar5 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar5);
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->numRow);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------UB------\n",0xf)
    ;
    if (0 < this->numRow) {
      lVar12 = 0;
      do {
        if (1e+200 <= (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12]) {
          builtin_strncpy(local_48,"inf",4);
        }
        else {
          sprintf(local_48,"%2.1g ");
        }
        *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
        sVar5 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar5);
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->numRow);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  return;
}

Assistant:

void HModel::util_reportModelDense() {
  cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<Astart[numCol]<<'\n';	
  if (numCol>10 || numRow>100) return;
  cout<<"\n-----cost-----\n";
  
  char buff [16];
  int colCostSz = colCost.size();
  for (int i=0; i<colCostSz; i++) { 
    sprintf(buff, "%2.1g ", colCost[i]);
    cout<<buff; 
  }
  cout<<endl;
  cout<<"------A------\n";
  for (int i=0;i<numRow;i++) {
    for (int j=0;j<numCol;j++) {
      
      int ind = Astart[j];
      while (Aindex[ind]!=i && ind<Astart[j+1]) 
	ind++;
      
      
      //if a_ij is nonzero print
      if (Aindex[ind]==i && ind<Astart[j+1])
	{	
	  sprintf(buff, "%2.1g ", Avalue[ind]);
	  cout<<setw(5)<<buff;
	}
      else cout<<setw(5)<<" ";
      
    }
    cout<<endl;
  }
  cout<<"------LB------\n";
  for (int i=0;i<numRow;i++) { 	
    if (rowLower[i]>-HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowLower[i]);
    else 
      sprintf(buff, "-inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
  cout<<"------UB------\n";
  for (int i=0;i<numRow;i++) { 
    if (rowUpper[i]<HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowUpper[i]);
    else 
      sprintf(buff, "inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
}